

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubemapFace.h
# Opt level: O3

void __thiscall vera::CubemapFace<float>::upload(CubemapFace<float> *this)

{
  glTexImage2D(*(undefined4 *)(cubemapFaceId + (long)this->id * 4),0,0x1907,this->width,this->height
               ,0,0x1907,0x1406,this->data);
  return;
}

Assistant:

void    upload() {
        GLenum type = GL_FLOAT;

        if (sizeof(T) == sizeof(char))
            type = GL_UNSIGNED_BYTE;
        
        GLenum internalFormat = GL_RGB;
        GLenum format = GL_RGB;

    #if defined(__EMSCRIPTEN__)
        if (sizeof(T) == sizeof(float)) {
            internalFormat = GL_RGB16F;
            // format = GL_RGB16F;
            // type = GL_HALF_FLOAT;
        }

    #elif defined (_WIN32)
        internalFormat = GL_RGB16F;
    #elif !defined(PLATFORM_RPI)
        internalFormat = GL_RGB;
    #endif

        glTexImage2D(cubemapFaceId[id], 0, internalFormat, width, height, 0, format, type, data);
    }